

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O0

void createDecodedString(char *input,size_t input_size,char *output)

{
  uchar uVar1;
  ulong local_28;
  size_t i;
  char *output_local;
  size_t input_size_local;
  char *input_local;
  
  local_28 = 0;
  i = (size_t)output;
  while (local_28 <= input_size) {
    if (input[local_28] == '%') {
      uVar1 = charFromNibbles(input[local_28 + 1],input[local_28 + 2]);
      *(uchar *)i = uVar1;
      local_28 = local_28 + 3;
    }
    else {
      *(char *)i = input[local_28];
      local_28 = local_28 + 1;
    }
    i = i + 1;
  }
  return;
}

Assistant:

static void createDecodedString(const char* input, size_t input_size, char* output)
{
    /* Note that there is no danger of reckless indexing here, as calculateDecodedStringSize()
    has already checked lengths of strings to ensure the formatting is always correct*/
    size_t i = 0;
    while (i <= input_size) //the <= instead of < ensures the '\0' will be copied
    {
        if (input[i] != '%')
        {
            *output++ = input[i];
            i++;
        }
        else
        {
            *output++ = charFromNibbles(input[i+1], input[i+2]);
            i += 3;
        }
    }
}